

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O1

void __thiscall sf2cute::SFZone::SetGenerator(SFZone *this,SFGeneratorItem generator)

{
  const_iterator cVar1;
  pointer *__ptr;
  __uniq_ptr_impl<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_> local_18
  ;
  
  cVar1 = FindGenerator(this,generator.op_);
  if (cVar1._M_current ==
      (this->generators_).
      super__Vector_base<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>,_std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_18._M_t.
    super__Tuple_impl<0UL,_sf2cute::SFGeneratorItem_*,_std::default_delete<sf2cute::SFGeneratorItem>_>
    .super__Head_base<0UL,_sf2cute::SFGeneratorItem_*,_false>._M_head_impl =
         (tuple<sf2cute::SFGeneratorItem_*,_std::default_delete<sf2cute::SFGeneratorItem>_>)
         operator_new(4);
    *(SFGeneratorItem *)
     local_18._M_t.
     super__Tuple_impl<0UL,_sf2cute::SFGeneratorItem_*,_std::default_delete<sf2cute::SFGeneratorItem>_>
     .super__Head_base<0UL,_sf2cute::SFGeneratorItem_*,_false>._M_head_impl = generator;
    std::
    vector<std::unique_ptr<sf2cute::SFGeneratorItem,std::default_delete<sf2cute::SFGeneratorItem>>,std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,std::default_delete<sf2cute::SFGeneratorItem>>>>
    ::
    emplace_back<std::unique_ptr<sf2cute::SFGeneratorItem,std::default_delete<sf2cute::SFGeneratorItem>>>
              ((vector<std::unique_ptr<sf2cute::SFGeneratorItem,std::default_delete<sf2cute::SFGeneratorItem>>,std::allocator<std::unique_ptr<sf2cute::SFGeneratorItem,std::default_delete<sf2cute::SFGeneratorItem>>>>
                *)&this->generators_,
               (unique_ptr<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>
                *)&local_18);
    if ((_Tuple_impl<0UL,_sf2cute::SFGeneratorItem_*,_std::default_delete<sf2cute::SFGeneratorItem>_>
         )local_18._M_t.
          super__Tuple_impl<0UL,_sf2cute::SFGeneratorItem_*,_std::default_delete<sf2cute::SFGeneratorItem>_>
          .super__Head_base<0UL,_sf2cute::SFGeneratorItem_*,_false>._M_head_impl !=
        (SFGeneratorItem *)0x0) {
      operator_delete((void *)local_18._M_t.
                              super__Tuple_impl<0UL,_sf2cute::SFGeneratorItem_*,_std::default_delete<sf2cute::SFGeneratorItem>_>
                              .super__Head_base<0UL,_sf2cute::SFGeneratorItem_*,_false>._M_head_impl
                      ,4);
    }
  }
  else {
    *((cVar1._M_current)->_M_t).
     super___uniq_ptr_impl<sf2cute::SFGeneratorItem,_std::default_delete<sf2cute::SFGeneratorItem>_>
     ._M_t.
     super__Tuple_impl<0UL,_sf2cute::SFGeneratorItem_*,_std::default_delete<sf2cute::SFGeneratorItem>_>
     .super__Head_base<0UL,_sf2cute::SFGeneratorItem_*,_false>._M_head_impl = generator;
  }
  return;
}

Assistant:

void SFZone::SetGenerator(SFGeneratorItem generator) {
  // Find the generator.
  const auto it = FindGenerator(generator.op());
  if (it == generators_.end()) {
    generators_.push_back(std::make_unique<SFGeneratorItem>(std::move(generator)));
  }
  else {
    const std::unique_ptr<SFGeneratorItem> & old_generator = *it;
    *old_generator = std::move(generator);
  }
}